

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp
# Opt level: O0

IterateResult __thiscall
gl4cts::DirectStateAccess::Framebuffers::TextureAttachmentErrorsTest::iterate
          (TextureAttachmentErrorsTest *this)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  int iVar17;
  ContextType ctxType;
  ApiType requiredApiType;
  RenderContext *pRVar18;
  undefined4 extraout_var;
  ContextInfo *this_00;
  bool is_error;
  bool is_ok;
  bool is_arb_direct_state_access;
  bool is_at_least_gl_45;
  Functions *gl;
  TextureAttachmentErrorsTest *this_local;
  long lVar19;
  
  pRVar18 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar17 = (*pRVar18->_vptr_RenderContext[3])();
  lVar19 = CONCAT44(extraout_var,iVar17);
  pRVar18 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  ctxType.super_ApiType.m_bits = (ApiType)(*pRVar18->_vptr_RenderContext[2])();
  requiredApiType = glu::ApiType::core(4,5);
  bVar1 = glu::contextSupports(ctxType,requiredApiType);
  this_00 = deqp::Context::getContextInfo((this->super_TestCase).m_context);
  bVar2 = glu::ContextInfo::isExtensionSupported(this_00,"GL_ARB_direct_state_access");
  if ((bVar1) || (bVar2)) {
    PrepareObjects(this);
    (**(code **)(lVar19 + 0xf18))(this->m_fbo_invalid,0x8ce0,this->m_to_valid,0);
    bVar1 = ExpectError(this,0x502,"NamedFramebufferTexture",false,true,false,true,true,"",true);
    (**(code **)(lVar19 + 0xf18))
              (this->m_fbo_valid,this->m_color_attachment_invalid,this->m_to_valid,0);
    bVar2 = ExpectError(this,0x502,"NamedFramebufferTexture",true,false,true,true,true,"",true);
    (**(code **)(lVar19 + 0xf18))(this->m_fbo_valid,this->m_attachment_invalid,this->m_to_valid,0);
    bVar3 = ExpectError(this,0x500,"NamedFramebufferTexture",true,false,false,true,true,"",true);
    (**(code **)(lVar19 + 0xf18))(this->m_fbo_valid,0x8ce0,this->m_to_invalid,0);
    bVar4 = ExpectError(this,0x501,"NamedFramebufferTexture",true,true,false,false,true,"",true);
    (**(code **)(lVar19 + 0xf18))(this->m_fbo_valid,0x8ce0,this->m_to_valid,this->m_level_invalid);
    bVar5 = ExpectError(this,0x501,"NamedFramebufferTexture",true,true,false,true,false,"",true);
    (**(code **)(lVar19 + 0xf18))(this->m_fbo_valid,0x8ce0,this->m_tbo_valid,0);
    bVar6 = ExpectError(this,0x502,"NamedFramebufferTexture",true,true,false,true,true,"buffer",true
                       );
    (**(code **)(lVar19 + 0xf40))(this->m_fbo_invalid,0x8ce0,this->m_to_array_valid,0);
    bVar7 = ExpectError(this,0x502,"NamedFramebufferTextureLayer",false,true,false,true,true,"",true
                       );
    (**(code **)(lVar19 + 0xf40))
              (this->m_fbo_valid,this->m_color_attachment_invalid,this->m_to_array_valid,0);
    bVar8 = ExpectError(this,0x502,"NamedFramebufferTextureLayer",true,false,true,true,true,"",true)
    ;
    (**(code **)(lVar19 + 0xf40))
              (this->m_fbo_valid,this->m_attachment_invalid,this->m_to_array_valid,0);
    bVar9 = ExpectError(this,0x500,"NamedFramebufferTextureLayer",true,false,false,true,true,"",true
                       );
    (**(code **)(lVar19 + 0xf40))(this->m_fbo_valid,0x8ce0,this->m_to_invalid,0);
    bVar10 = ExpectError(this,0x502,"NamedFramebufferTextureLayer",true,true,false,false,true,"",
                         true);
    (**(code **)(lVar19 + 0xf40))
              (this->m_fbo_valid,0x8ce0,this->m_to_array_valid,this->m_level_invalid,0);
    bVar11 = ExpectError(this,0x501,"NamedFramebufferTextureLayer",true,true,false,true,false,"",
                         true);
    (**(code **)(lVar19 + 0xf40))(this->m_fbo_valid,0x8ce0,this->m_tbo_valid,0);
    bVar12 = ExpectError(this,0x502,"NamedFramebufferTextureLayer",true,true,false,true,true,
                         "buffer",true);
    (**(code **)(lVar19 + 0xf40))
              (this->m_fbo_valid,0x8ce0,this->m_to_3d_valid,0,this->m_max_3d_texture_depth);
    bVar13 = ExpectError(this,0x501,"NamedFramebufferTextureLayer",true,true,false,true,true,
                         "3D texture",false);
    (**(code **)(lVar19 + 0xf40))
              (this->m_fbo_valid,0x8ce0,this->m_to_array_valid,0,this->m_max_array_texture_layers);
    bVar14 = ExpectError(this,0x501,"NamedFramebufferTextureLayer",true,true,false,true,true,"array"
                         ,false);
    (**(code **)(lVar19 + 0xf40))
              (this->m_fbo_valid,0x8ce0,this->m_to_cubearray_valid,0,
               this->m_max_cube_map_texture_size);
    bVar15 = ExpectError(this,0x501,"NamedFramebufferTextureLayer",true,true,false,true,true,
                         "cuba map array",false);
    (**(code **)(lVar19 + 0xf40))(this->m_fbo_valid,0x8ce0,this->m_to_layer_invalid,0);
    bVar16 = ExpectError(this,0x502,"NamedFramebufferTextureLayer",true,true,false,false,true,
                         "rectangle",true);
    Clean(this);
    if ((bVar15 &&
        (bVar14 &&
        (bVar13 &&
        (bVar12 &&
        (bVar11 &&
        (bVar10 &&
        (bVar9 && (bVar8 && (bVar7 && (bVar6 && (bVar5 && (bVar4 && (bVar3 && (bVar2 && bVar1)))))))
        ))))))) && bVar16) {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
                 "Pass");
    }
    else {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                 "Fail");
    }
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_NOT_SUPPORTED,"Not Supported");
  }
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult TextureAttachmentErrorsTest::iterate()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Get context setup. */
	bool is_at_least_gl_45 = (glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(4, 5)));
	bool is_arb_direct_state_access = m_context.getContextInfo().isExtensionSupported("GL_ARB_direct_state_access");

	if ((!is_at_least_gl_45) && (!is_arb_direct_state_access))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not Supported");

		return STOP;
	}

	/* Running tests. */
	bool is_ok	= true;
	bool is_error = false;

	try
	{
		/* Prepare objects. */
		PrepareObjects();

		/********** NamedFramebufferTexture **************/

		/* Invalid Framebuffer ID. */
		gl.namedFramebufferTexture(m_fbo_invalid, GL_COLOR_ATTACHMENT0, m_to_valid, 0);

		is_ok &= ExpectError(GL_INVALID_OPERATION, "NamedFramebufferTexture", false, true, false, true, true, "", true);

		/* Invalid Color Attachment. */
		gl.namedFramebufferTexture(m_fbo_valid, m_color_attachment_invalid, m_to_valid, 0);

		is_ok &= ExpectError(GL_INVALID_OPERATION, "NamedFramebufferTexture", true, false, true, true, true, "", true);

		/* Invalid Attachment. */
		gl.namedFramebufferTexture(m_fbo_valid, m_attachment_invalid, m_to_valid, 0);

		is_ok &= ExpectError(GL_INVALID_ENUM, "NamedFramebufferTexture", true, false, false, true, true, "", true);

		/* Invalid Texture ID. */
		gl.namedFramebufferTexture(m_fbo_valid, GL_COLOR_ATTACHMENT0, m_to_invalid, 0);

		is_ok &= ExpectError(GL_INVALID_VALUE, "NamedFramebufferTexture", true, true, false, false, true, "", true);

		/* Invalid Level. */
		gl.namedFramebufferTexture(m_fbo_valid, GL_COLOR_ATTACHMENT0, m_to_valid, m_level_invalid);

		is_ok &= ExpectError(GL_INVALID_VALUE, "NamedFramebufferTexture", true, true, false, true, false, "", true);

		/* Buffer texture. */
		gl.namedFramebufferTexture(m_fbo_valid, GL_COLOR_ATTACHMENT0, m_tbo_valid, 0);

		is_ok &=
			ExpectError(GL_INVALID_OPERATION, "NamedFramebufferTexture", true, true, false, true, true, "buffer", true);

		/********** NamedFramebufferTextureLayer **************/

		/* Invalid Framebuffer ID. */
		gl.namedFramebufferTextureLayer(m_fbo_invalid, GL_COLOR_ATTACHMENT0, m_to_array_valid, 0, 0);

		is_ok &=
			ExpectError(GL_INVALID_OPERATION, "NamedFramebufferTextureLayer", false, true, false, true, true, "", true);

		/* Invalid Color Attachment. */
		gl.namedFramebufferTextureLayer(m_fbo_valid, m_color_attachment_invalid, m_to_array_valid, 0, 0);

		is_ok &=
			ExpectError(GL_INVALID_OPERATION, "NamedFramebufferTextureLayer", true, false, true, true, true, "", true);

		/* Invalid Attachment. */
		gl.namedFramebufferTextureLayer(m_fbo_valid, m_attachment_invalid, m_to_array_valid, 0, 0);

		is_ok &= ExpectError(GL_INVALID_ENUM, "NamedFramebufferTextureLayer", true, false, false, true, true, "", true);

		/* Invalid Texture ID. */
		gl.namedFramebufferTextureLayer(m_fbo_valid, GL_COLOR_ATTACHMENT0, m_to_invalid, 0, 0);

		is_ok &=
			ExpectError(GL_INVALID_OPERATION, "NamedFramebufferTextureLayer", true, true, false, false, true, "", true);

		/* Invalid Level. */
		gl.namedFramebufferTextureLayer(m_fbo_valid, GL_COLOR_ATTACHMENT0, m_to_array_valid, m_level_invalid, 0);

		is_ok &=
			ExpectError(GL_INVALID_VALUE, "NamedFramebufferTextureLayer", true, true, false, true, false, "", true);

		/* Buffer texture. */
		gl.namedFramebufferTextureLayer(m_fbo_valid, GL_COLOR_ATTACHMENT0, m_tbo_valid, 0, 0);

		is_ok &= ExpectError(GL_INVALID_OPERATION, "NamedFramebufferTextureLayer", true, true, false, true, true,
							 "buffer", true);

		/* Check that INVALID_VALUE error is generated by NamedFramebufferTextureLayer if texture is a three-dimensional
		 texture, and layer is larger than the value of MAX_3D_TEXTURE_SIZE or GL_MAX_DEEP_3D_TEXTURE_DEPTH_NV (if available) minus one. */
		gl.namedFramebufferTextureLayer(m_fbo_valid, GL_COLOR_ATTACHMENT0, m_to_3d_valid, 0, m_max_3d_texture_depth);

		is_ok &= ExpectError(GL_INVALID_VALUE, "NamedFramebufferTextureLayer", true, true, false, true, true,
							 "3D texture", false);

		/* Check that INVALID_VALUE error is generated by NamedFramebufferTextureLayer if texture is an array texture,
		 and layer is larger than the value of MAX_ARRAY_TEXTURE_LAYERS minus one. */
		gl.namedFramebufferTextureLayer(m_fbo_valid, GL_COLOR_ATTACHMENT0, m_to_array_valid, 0,
										m_max_array_texture_layers);

		is_ok &= ExpectError(GL_INVALID_VALUE, "NamedFramebufferTextureLayer", true, true, false, true, true, "array",
							 false);

		/* Check that INVALID_VALUE error is generated by NamedFramebufferTextureLayer if texture is a cube map array texture,
		 and (layer / 6) is larger than the value of MAX_CUBE_MAP_TEXTURE_SIZE minus one (see section 9.8).
		 Check that INVALID_VALUE error is generated by NamedFramebufferTextureLayer if texture is non-zero
		 and layer is negative. */
		gl.namedFramebufferTextureLayer(m_fbo_valid, GL_COLOR_ATTACHMENT0, m_to_cubearray_valid, 0,
										m_max_cube_map_texture_size);

		is_ok &= ExpectError(GL_INVALID_VALUE, "NamedFramebufferTextureLayer", true, true, false, true, true,
							 "cuba map array", false);

		/* Check that INVALID_OPERATION error is generated by NamedFramebufferTextureLayer if texture is non-zero
		 and is not the name of a three-dimensional, two-dimensional multisample array, one- or two-dimensional array,
		 or cube map array texture. */
		gl.namedFramebufferTextureLayer(m_fbo_valid, GL_COLOR_ATTACHMENT0, m_to_layer_invalid, 0, 0);

		is_ok &= ExpectError(GL_INVALID_OPERATION, "NamedFramebufferTextureLayer", true, true, false, false, true,
							 "rectangle", true);
	}
	catch (...)
	{
		is_ok	= false;
		is_error = true;
	}

	/* Cleanup. */
	Clean();

	/* Result's setup. */
	if (is_ok)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		if (is_error)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_INTERNAL_ERROR, "Error");
		}
		else
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		}
	}

	return STOP;
}